

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeInteger.c
# Opt level: O2

asn_enc_rval_t *
NativeInteger_encode_xer
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,int ilevel,
          xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  int iVar2;
  char *__format;
  char scratch [32];
  
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
  }
  else {
    if (td->specifics == (void *)0x0) {
      __format = "%ld";
    }
    else {
      __format = "%lu";
      if (*(int *)((long)td->specifics + 0x20) == 0) {
        __format = "%ld";
      }
    }
    iVar1 = snprintf(scratch,0x20,__format,*sptr);
    if (0xffffffe0 < iVar1 - 0x20U) {
      iVar2 = (*cb)(scratch,(long)iVar1,app_key);
      if (-1 < iVar2) {
        __return_storage_ptr__->encoded = (long)iVar1;
        __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
        __return_storage_ptr__->structure_ptr = (void *)0x0;
        return __return_storage_ptr__;
      }
    }
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
NativeInteger_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	char scratch[32];	/* Enough for 64-bit int */
	asn_enc_rval_t er;
	const long *native = (const long *)sptr;

	(void)ilevel;
	(void)flags;

	if(!native) ASN__ENCODE_FAILED;

	er.encoded = snprintf(scratch, sizeof(scratch),
			(specs && specs->field_unsigned)
			? "%lu" : "%ld", *native);
	if(er.encoded <= 0 || (size_t)er.encoded >= sizeof(scratch)
		|| cb(scratch, er.encoded, app_key) < 0)
		ASN__ENCODE_FAILED;

	ASN__ENCODED_OK(er);
}